

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O3

void __thiscall libtorrent::aux::tracker_list::completed(tracker_list *this,time_point32 now)

{
  node_ptr plVar1;
  announce_entry *t;
  node_ptr plVar2;
  announce_endpoint *aep;
  node_ptr plVar3;
  long lVar4;
  
  for (plVar2 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
      plVar2 != &(this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node;
      plVar2 = plVar2->next_) {
    plVar1 = plVar2[5].prev_;
    for (plVar3 = plVar2[5].next_; plVar3 != plVar1; plVar3 = (node_ptr)&plVar3[0xc].prev_) {
      if (((ulong)plVar3[0xb].next_ & 1) != 0) {
        lVar4 = 100;
        do {
          if ((*(byte *)((long)&plVar3->next_ + lVar4 + 1) & 2) == 0) {
            ((duration *)((long)plVar3 + lVar4 + -0x14))->__r = (rep_conflict)now.__d.__r;
            ((duration *)((long)&plVar3[-1].next_ + lVar4))->__r = (rep_conflict)now.__d.__r;
          }
          lVar4 = lVar4 + 0x48;
        } while (lVar4 != 0xf4);
      }
    }
  }
  return;
}

Assistant:

void tracker_list::completed(time_point32 const now)
{
	INVARIANT_CHECK;
	for (auto& t : m_trackers)
	{
		for (auto& aep : t.endpoints)
		{
			if (!aep.enabled) continue;
			for (auto& a : aep.info_hashes)
			{
				if (a.complete_sent) continue;
				a.next_announce = now;
				a.min_announce = now;
			}
		}
	}
}